

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

bool __thiscall pbrt::SampledSpectrum::operator_cast_to_bool(SampledSpectrum *this)

{
  float *pfVar1;
  array<float,_4> *in_RDI;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (3 < local_14) {
      return false;
    }
    pfVar1 = pstd::array<float,_4>::operator[](in_RDI,(long)local_14);
    if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

operator bool() const {
        for (int i = 0; i < NSpectrumSamples; ++i)
            if (values[i] != 0)
                return true;
        return false;
    }